

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_l2_projection_hessian(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *hessian)

{
  REF_NODE pRVar1;
  REF_DBL *grad_00;
  REF_DBL *scalar_00;
  REF_DBL *grad_01;
  REF_DBL *grad_02;
  REF_DBL *grad_03;
  REF_STATUS ref_private_macro_code_rxs_3;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT ref_malloc_init_i_4;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_DBL *gradz;
  REF_DBL *grady;
  REF_DBL *gradx;
  REF_DBL *dsdx;
  REF_DBL *grad;
  REF_INT node;
  REF_INT i;
  REF_NODE ref_node;
  REF_DBL *hessian_local;
  REF_DBL *scalar_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  if (pRVar1->max * 3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x17e,
           "ref_recon_l2_projection_hessian","malloc grad of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    grad_00 = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
    if (grad_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x17e
             ,"ref_recon_l2_projection_hessian","malloc grad of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0;
          SBORROW4(ref_malloc_init_i_2,pRVar1->max * 3) !=
          ref_malloc_init_i_2 + pRVar1->max * -3 < 0; ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1)
      {
        grad_00[ref_malloc_init_i_2] = 0.0;
      }
      if (pRVar1->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x17f,"ref_recon_l2_projection_hessian","malloc dsdx of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        scalar_00 = (REF_DBL *)malloc((long)pRVar1->max << 3);
        if (scalar_00 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x17f,"ref_recon_l2_projection_hessian","malloc dsdx of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_malloc_init_i_3 = 0; ref_malloc_init_i_3 < pRVar1->max;
              ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
            scalar_00[ref_malloc_init_i_3] = 0.0;
          }
          if (pRVar1->max * 3 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x180,"ref_recon_l2_projection_hessian","malloc gradx of REF_DBL negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            grad_01 = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
            if (grad_01 == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x180,"ref_recon_l2_projection_hessian","malloc gradx of REF_DBL NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (ref_malloc_init_i_4 = 0;
                  SBORROW4(ref_malloc_init_i_4,pRVar1->max * 3) !=
                  ref_malloc_init_i_4 + pRVar1->max * -3 < 0;
                  ref_malloc_init_i_4 = ref_malloc_init_i_4 + 1) {
                grad_01[ref_malloc_init_i_4] = 0.0;
              }
              if (pRVar1->max * 3 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x181,"ref_recon_l2_projection_hessian","malloc grady of REF_DBL negative");
                ref_grid_local._4_4_ = 1;
              }
              else {
                grad_02 = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
                if (grad_02 == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x181,"ref_recon_l2_projection_hessian","malloc grady of REF_DBL NULL");
                  ref_grid_local._4_4_ = 2;
                }
                else {
                  for (ref_private_macro_code_rxs = 0;
                      SBORROW4(ref_private_macro_code_rxs,pRVar1->max * 3) !=
                      ref_private_macro_code_rxs + pRVar1->max * -3 < 0;
                      ref_private_macro_code_rxs = ref_private_macro_code_rxs + 1) {
                    grad_02[ref_private_macro_code_rxs] = 0.0;
                  }
                  if (pRVar1->max * 3 < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x182,"ref_recon_l2_projection_hessian",
                           "malloc gradz of REF_DBL negative");
                    ref_grid_local._4_4_ = 1;
                  }
                  else {
                    grad_03 = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
                    if (grad_03 == (REF_DBL *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                             ,0x182,"ref_recon_l2_projection_hessian","malloc gradz of REF_DBL NULL"
                            );
                      ref_grid_local._4_4_ = 2;
                    }
                    else {
                      for (ref_private_macro_code_rxs_1 = 0;
                          SBORROW4(ref_private_macro_code_rxs_1,pRVar1->max * 3) !=
                          ref_private_macro_code_rxs_1 + pRVar1->max * -3 < 0;
                          ref_private_macro_code_rxs_1 = ref_private_macro_code_rxs_1 + 1) {
                        grad_03[ref_private_macro_code_rxs_1] = 0.0;
                      }
                      ref_grid_local._4_4_ = ref_recon_l2_projection_grad(ref_grid,scalar,grad_00);
                      if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 4)) {
                        for (grad._0_4_ = 0; (int)grad < pRVar1->max; grad._0_4_ = (int)grad + 1) {
                          if (((-1 < (int)grad) && ((int)grad < pRVar1->max)) &&
                             (-1 < pRVar1->global[(int)grad])) {
                            scalar_00[(int)grad] = grad_00[(int)grad * 3];
                          }
                        }
                        ref_grid_local._4_4_ =
                             ref_recon_l2_projection_grad(ref_grid,scalar_00,grad_01);
                        if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 4)) {
                          for (grad._0_4_ = 0; (int)grad < pRVar1->max; grad._0_4_ = (int)grad + 1)
                          {
                            if (((-1 < (int)grad) && ((int)grad < pRVar1->max)) &&
                               (-1 < pRVar1->global[(int)grad])) {
                              scalar_00[(int)grad] = grad_00[(int)grad * 3 + 1];
                            }
                          }
                          ref_grid_local._4_4_ =
                               ref_recon_l2_projection_grad(ref_grid,scalar_00,grad_02);
                          if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 4)) {
                            for (grad._0_4_ = 0; (int)grad < pRVar1->max; grad._0_4_ = (int)grad + 1
                                ) {
                              if (((-1 < (int)grad) && ((int)grad < pRVar1->max)) &&
                                 (-1 < pRVar1->global[(int)grad])) {
                                scalar_00[(int)grad] = grad_00[(int)grad * 3 + 2];
                              }
                            }
                            ref_grid_local._4_4_ =
                                 ref_recon_l2_projection_grad(ref_grid,scalar_00,grad_03);
                            if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 4)) {
                              for (grad._0_4_ = 0; (int)grad < pRVar1->max;
                                  grad._0_4_ = (int)grad + 1) {
                                if (((-1 < (int)grad) && ((int)grad < pRVar1->max)) &&
                                   (-1 < pRVar1->global[(int)grad])) {
                                  hessian[(int)grad * 6] = grad_01[(int)grad * 3];
                                  hessian[(int)grad * 6 + 1] =
                                       (grad_01[(int)grad * 3 + 1] + grad_02[(int)grad * 3]) * 0.5;
                                  hessian[(int)grad * 6 + 2] =
                                       (grad_01[(int)grad * 3 + 2] + grad_03[(int)grad * 3]) * 0.5;
                                  hessian[(int)grad * 6 + 3] = grad_02[(int)grad * 3 + 1];
                                  hessian[(int)grad * 6 + 4] =
                                       (grad_02[(int)grad * 3 + 2] + grad_03[(int)grad * 3 + 1]) *
                                       0.5;
                                  hessian[(int)grad * 6 + 5] = grad_03[(int)grad * 3 + 2];
                                }
                              }
                              if (grad_03 != (REF_DBL *)0x0) {
                                free(grad_03);
                              }
                              if (grad_02 != (REF_DBL *)0x0) {
                                free(grad_02);
                              }
                              if (grad_01 != (REF_DBL *)0x0) {
                                free(grad_01);
                              }
                              if (scalar_00 != (REF_DBL *)0x0) {
                                free(scalar_00);
                              }
                              if (grad_00 != (REF_DBL *)0x0) {
                                free(grad_00);
                              }
                              ref_grid_local._4_4_ = 0;
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                     ,0x194,"ref_recon_l2_projection_hessian",
                                     (ulong)ref_grid_local._4_4_,"gradz");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                   ,399,"ref_recon_l2_projection_hessian",
                                   (ulong)ref_grid_local._4_4_,"grady");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                 ,0x18a,"ref_recon_l2_projection_hessian",
                                 (ulong)ref_grid_local._4_4_,"gradx");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                               ,0x185,"ref_recon_l2_projection_hessian",(ulong)ref_grid_local._4_4_,
                               "l2 grad");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_l2_projection_hessian(REF_GRID ref_grid,
                                                          REF_DBL *scalar,
                                                          REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL *grad, *dsdx, *gradx, *grady, *gradz;

  ref_malloc_init(grad, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(dsdx, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradx, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grady, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradz, 3 * ref_node_max(ref_node), REF_DBL, 0.0);

  RXS(ref_recon_l2_projection_grad(ref_grid, scalar, grad), REF_DIV_ZERO,
      "l2 grad");

  i = 0;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RXS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradx), REF_DIV_ZERO,
      "gradx");

  i = 1;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RXS(ref_recon_l2_projection_grad(ref_grid, dsdx, grady), REF_DIV_ZERO,
      "grady");

  i = 2;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RXS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradz), REF_DIV_ZERO,
      "gradz");

  /* average off-diagonals */
  each_ref_node_valid_node(ref_node, node) {
    hessian[0 + 6 * node] = gradx[0 + 3 * node];
    hessian[1 + 6 * node] = 0.5 * (gradx[1 + 3 * node] + grady[0 + 3 * node]);
    hessian[2 + 6 * node] = 0.5 * (gradx[2 + 3 * node] + gradz[0 + 3 * node]);
    hessian[3 + 6 * node] = grady[1 + 3 * node];
    hessian[4 + 6 * node] = 0.5 * (grady[2 + 3 * node] + gradz[1 + 3 * node]);
    hessian[5 + 6 * node] = gradz[2 + 3 * node];
  }

  ref_free(gradz);
  ref_free(grady);
  ref_free(gradx);
  ref_free(dsdx);
  ref_free(grad);

  return REF_SUCCESS;
}